

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileProfilingData.cxx
# Opt level: O1

void __thiscall cmMakefileProfilingData::~cmMakefileProfilingData(cmMakefileProfilingData *this)

{
  StreamWriter *pSVar1;
  _func_int **pp_Var2;
  undefined8 uVar3;
  
  if (*(int *)(&(this->ProfileStream).super_basic_ostream<char,_std::char_traits<char>_>.field_0x20
              + (long)(this->ProfileStream).super_basic_ostream<char,_std::char_traits<char>_>.
                      _vptr_basic_ostream[-3]) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"]",1);
    std::ofstream::close();
  }
  pSVar1 = (this->JsonWriter)._M_t.
           super___uniq_ptr_impl<Json::StreamWriter,_std::default_delete<Json::StreamWriter>_>._M_t.
           super__Tuple_impl<0UL,_Json::StreamWriter_*,_std::default_delete<Json::StreamWriter>_>.
           super__Head_base<0UL,_Json::StreamWriter_*,_false>._M_head_impl;
  if (pSVar1 != (StreamWriter *)0x0) {
    (*pSVar1->_vptr_StreamWriter[1])();
  }
  (this->JsonWriter)._M_t.
  super___uniq_ptr_impl<Json::StreamWriter,_std::default_delete<Json::StreamWriter>_>._M_t.
  super__Tuple_impl<0UL,_Json::StreamWriter_*,_std::default_delete<Json::StreamWriter>_>.
  super__Head_base<0UL,_Json::StreamWriter_*,_false>._M_head_impl = (StreamWriter *)0x0;
  uVar3 = _EVP_PKEY_get_bn_param;
  pp_Var2 = _VTT;
  (this->ProfileStream).super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       _VTT;
  *(undefined8 *)
   ((long)&(this->ProfileStream).super_basic_ostream<char,_std::char_traits<char>_>.
           _vptr_basic_ostream + (long)pp_Var2[-3]) = uVar3;
  std::filebuf::~filebuf
            ((filebuf *)
             &(this->ProfileStream).super_basic_ostream<char,_std::char_traits<char>_>.field_0x8);
  std::ios_base::~ios_base
            ((ios_base *)
             &(this->ProfileStream).super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8);
  return;
}

Assistant:

cmMakefileProfilingData::~cmMakefileProfilingData() noexcept
{
  if (this->ProfileStream.good()) {
    try {
      this->ProfileStream << "]";
      this->ProfileStream.close();
    } catch (...) {
      cmSystemTools::Error("Error writing profiling output!");
    }
  }
}